

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-lexer.cpp
# Opt level: O0

void __thiscall
LexerTest_LexInfinity_Test::~LexerTest_LexInfinity_Test(LexerTest_LexInfinity_Test *this)

{
  LexerTest_LexInfinity_Test *this_local;
  
  ~LexerTest_LexInfinity_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(LexerTest, LexInfinity) {
  EXPECT_EQ(Lexer("inf"sv).takeF32(), INFINITY);
  EXPECT_EQ(Lexer("inf"sv).takeF64(), INFINITY);

  EXPECT_EQ(Lexer("+inf"sv).takeF32(), INFINITY);
  EXPECT_EQ(Lexer("+inf"sv).takeF64(), INFINITY);

  EXPECT_EQ(Lexer("-inf"sv).takeF32(), -INFINITY);
  EXPECT_EQ(Lexer("-inf"sv).takeF64(), -INFINITY);

  EXPECT_FALSE(Lexer("infjunk"sv).takeF32());
  EXPECT_FALSE(Lexer("infjunk"sv).takeF64());

  EXPECT_FALSE(Lexer("Inf"sv).takeF32());
  EXPECT_FALSE(Lexer("Inf"sv).takeF64());

  EXPECT_FALSE(Lexer("INF"sv).takeF32());
  EXPECT_FALSE(Lexer("INF"sv).takeF64());

  EXPECT_FALSE(Lexer("infinity"sv).takeF32());
  EXPECT_FALSE(Lexer("infinity"sv).takeF64());
}